

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<QWidget*,QHashDummyValue>::tryEmplace_impl<QWidget*const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QWidget*,QHashDummyValue> *this,
          QWidget **key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Bucket BVar4;
  size_t sVar5;
  Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *pDVar6;
  Node<QWidget_*,_QHashDummyValue> *pNVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Bucket local_58;
  QHash<QWidget_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)this == 0) {
    pDVar6 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::detached
                       ((Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0);
    *(Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> **)this = pDVar6;
  }
  local_40.d = (Data *)0x0;
  uVar8 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar8 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d;
  uVar8 = uVar8 >> 0x20 ^
          *(ulong *)(*(Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> **)this + 0x18) ^ uVar8;
  local_58.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_58.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
             findBucketWithHash<QWidget*>
                       (*(Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> **)this,key,uVar8);
  uVar1 = (local_58.span)->offsets[local_58.index];
  puVar2 = *(uint **)this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_00405269:
    QHash<QWidget_*,_QHashDummyValue>::operator=
              (&local_40,(QHash<QWidget_*,_QHashDummyValue> *)this);
    BVar4 = local_58;
    if (uVar1 == 0xff) {
      bVar10 = *(ulong *)(*(long *)this + 0x10) >> 1 <= *(ulong *)(*(long *)this + 8);
    }
    else {
      bVar10 = false;
    }
    pDVar6 = *(Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> **)this;
    sVar5 = local_58.index;
    uVar9 = (long)local_58.span - (long)pDVar6->spans;
    if (bVar10) {
      pDVar6 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::detached
                         (pDVar6,pDVar6->size + 1);
    }
    else {
      pDVar6 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::detached(pDVar6)
      ;
    }
    *(Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> **)this = pDVar6;
    if (bVar10) {
      local_58 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                 findBucketWithHash<QWidget*>
                           ((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)pDVar6,key,uVar8);
    }
    else {
      local_58.index._0_4_ = (uint)BVar4.index & 0x7f;
      local_58.span = pDVar6->spans + (((uVar9 >> 4) * 0x1c71c71c71c71c80 | sVar5) >> 7);
      local_58.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00405351;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_00405269;
  }
  if (uVar1 == 0xff) {
    pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::Bucket::insert
                       (&local_58);
    pNVar7->key = *key;
    *(long *)(*(long *)this + 8) = *(long *)(*(long *)this + 8) + 1;
  }
LAB_00405351:
  pSVar3 = (*(Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> **)this)->spans;
  (__return_storage_ptr__->iterator).i.d =
       *(Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> **)this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)local_58.span - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | local_58.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }